

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptGeneratorFunction * __thiscall
Js::JavascriptLibrary::CreateGeneratorFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,bool isAnonymousFunction)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *this_00;
  ScriptConfiguration *this_01;
  undefined4 *puVar3;
  Recycler *pRVar4;
  JavascriptGeneratorFunction *this_02;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_51;
  TrackAllocData local_50;
  DynamicType *local_28;
  DynamicType *type;
  JavascriptMethod p_Stack_18;
  bool isAnonymousFunction_local;
  JavascriptMethod entryPoint_local;
  JavascriptLibrary *this_local;
  
  type._7_1_ = isAnonymousFunction;
  p_Stack_18 = entryPoint;
  entryPoint_local = (JavascriptMethod)this;
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  this_01 = ScriptContext::GetConfig(this_00);
  bVar2 = ScriptConfiguration::IsES6GeneratorsEnabled(this_01);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x19b6,"(scriptContext->GetConfig()->IsES6GeneratorsEnabled())",
                                "scriptContext->GetConfig()->IsES6GeneratorsEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_28 = CreateDeferredPrototypeGeneratorFunctionType
                       (this,p_Stack_18,(bool)(type._7_1_ & 1),false);
  pRVar4 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&JavascriptGeneratorFunction::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x19ba);
  pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_50);
  this_02 = (JavascriptGeneratorFunction *)new<(Memory::ObjectInfoBits)1>(0x38,pRVar4,&local_51);
  JavascriptGeneratorFunction::JavascriptGeneratorFunction
            (this_02,local_28,(GeneratorVirtualScriptFunction *)0x0);
  return this_02;
}

Assistant:

JavascriptGeneratorFunction* JavascriptLibrary::CreateGeneratorFunction(JavascriptMethod entryPoint, bool isAnonymousFunction)
    {
        Assert(scriptContext->GetConfig()->IsES6GeneratorsEnabled());

        DynamicType* type = CreateDeferredPrototypeGeneratorFunctionType(entryPoint, isAnonymousFunction);

        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptGeneratorFunction, type, nullptr);
    }